

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_layout_mapping_left_stepping_padding.cpp
# Opt level: O2

void test_2d_dynamic<1ul,5ul,0ul,1ul,30ul,30ul>(void)

{
  pointer piVar1;
  reference pvVar2;
  int i;
  ulong uVar3;
  ulong *puVar4;
  int i_2;
  int j;
  ulong uVar5;
  pointer local_e0;
  value_type true_idx;
  ulong local_d0;
  ulong local_c8;
  long local_c0;
  long local_b8;
  long local_b0;
  long local_a8;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_a0;
  pointer local_90;
  vector<int,_std::allocator<int>_> data;
  ulong *local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  long local_48;
  dimensions<18446744073709551615UL,_18446744073709551615UL> local_40;
  
  local_d0 = 0x1e;
  local_c8 = 0x1e;
  local_c0 = 1;
  local_b8 = 1;
  local_b0 = 0;
  local_a8 = 1;
  local_70 = &local_d0;
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<std::experimental::layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>::dynamic_stride_generator,_0UL,_1UL,_nullptr>
            (&local_a0,&local_70);
  local_70 = (ulong *)CONCAT71(local_70._1_7_,1);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xaf,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&local_70,(bool *)&data);
  local_70 = (ulong *)local_a0.dynamic_dims_._M_elems[0];
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(0))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb1,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(int *)&data);
  local_70 = (ulong *)local_a0.dynamic_dims_._M_elems[1];
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,1);
  boost::detail::test_eq_impl<unsigned_long,int>
            ("(l.stride(1))","1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb2,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(int *)&data);
  local_70 = (ulong *)(local_c8 * local_d0);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x384;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.size())","X * Y",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb4,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&data);
  local_70 = (ulong *)((local_b8 * local_c8 + local_a8) * (local_c0 * local_d0 + local_b0));
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xb5,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&local_70,(unsigned_long *)&data);
  local_70 = (ulong *)0x1e;
  local_68 = 6;
  local_60 = 1;
  local_58 = 5;
  local_50 = 0;
  local_48 = 1;
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)&local_70;
  std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>::
  dimensions<std::experimental::layout_mapping_regular_precomputed_strides<std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::dimensions<18446744073709551615UL,_18446744073709551615UL>,_std::experimental::detail::integer_sequence<unsigned_long,_0UL,_1UL>_>::dynamic_stride_generator,_0UL,_1UL,_nullptr>
            (&local_40,&data);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT71(data.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._1_7_,1);
  true_idx = CONCAT71(true_idx._1_7_,1);
  boost::detail::test_eq_impl<bool,bool>
            ("(sub_l.is_regular())","true",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xbd,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(bool *)&data,(bool *)&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_40.dynamic_dims_._M_elems[0];
  true_idx = 1;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(0))","StepX",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xbf,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)local_40.dynamic_dims_._M_elems[1];
  true_idx = 5;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.stride(1))","StepY",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc0,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)(local_68 * (long)local_70);
  true_idx = 0xb4;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.size())","(X / StepX) * (Y / StepY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc2,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)((local_58 * local_68 + local_48) * (local_60 * (long)local_70 + local_50));
  true_idx = 0x3a2;
  boost::detail::test_eq_impl<unsigned_long,unsigned_long>
            ("(sub_l.span())","(X + PadX) * (Y + PadY)",
             "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
             ,0xc3,
             "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
             ,(unsigned_long *)&data,&true_idx);
  true_idx = CONCAT44(true_idx._4_4_,0x2a);
  std::vector<int,_std::allocator<int>_>::vector
            (&data,(local_c8 + local_a8) * (local_b0 + local_d0),(value_type_conflict1 *)&true_idx,
             (allocator_type *)&local_e0);
  piVar1 = data.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  for (uVar5 = 0; uVar5 < local_a8 + local_c8; uVar5 = uVar5 + 1) {
    for (uVar3 = 0; uVar3 < local_b0 + local_d0; uVar3 = uVar3 + 1) {
      true_idx = (local_b0 + local_d0) * uVar5 + uVar3;
      local_e0 = (pointer)(local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                          local_a0.dynamic_dims_._M_elems[1] * uVar5);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xd1,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_e0,&true_idx);
      local_e0 = piVar1 + local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                          local_a0.dynamic_dims_._M_elems[1] * uVar5;
      local_90 = piVar1 + true_idx;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xd3,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_e0,&local_90);
      if ((uVar3 < local_d0) || (local_d0 + local_b0 <= uVar3)) {
        if ((local_c8 <= uVar5) && (uVar5 < local_c8 + local_a8)) {
          piVar1[local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                 local_a0.dynamic_dims_._M_elems[1] * uVar5] = 0x18;
          local_e0._0_4_ = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0xe5,
                     "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,piVar1 + local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                               local_a0.dynamic_dims_._M_elems[1] * uVar5,(int *)&local_e0);
          pvVar2 = std::vector<int,_std::allocator<int>_>::at
                             (&data,local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                                    local_a0.dynamic_dims_._M_elems[1] * uVar5);
          local_e0 = (pointer)CONCAT44(local_e0._4_4_,0x18);
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0xe8,
                     "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,pvVar2,(int *)&local_e0);
        }
      }
      else {
        piVar1[local_a0.dynamic_dims_._M_elems[0] * uVar3 +
               local_a0.dynamic_dims_._M_elems[1] * uVar5] = 0x11;
        local_e0._0_4_ = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0xda,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar1 + local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                             local_a0.dynamic_dims_._M_elems[1] * uVar5,(int *)&local_e0);
        pvVar2 = std::vector<int,_std::allocator<int>_>::at
                           (&data,local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                                  local_a0.dynamic_dims_._M_elems[1] * uVar5);
        local_e0 = (pointer)CONCAT44(local_e0._4_4_,0x11);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0xdd,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,pvVar2,(int *)&local_e0);
      }
    }
  }
  for (uVar5 = 0; uVar5 < local_68; uVar5 = uVar5 + 1) {
    for (puVar4 = (ulong *)0x0; puVar4 < local_70; puVar4 = (ulong *)((long)puVar4 + 1)) {
      true_idx = local_60 * (long)puVar4 + local_58 * uVar5 * ((long)local_70 * local_60 + local_b0)
      ;
      local_e0 = (pointer)(local_40.dynamic_dims_._M_elems[0] * (long)puVar4 +
                          local_40.dynamic_dims_._M_elems[1] * uVar5);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(sub_l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xf4,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_e0,&true_idx);
      local_e0 = piVar1 + local_40.dynamic_dims_._M_elems[0] * (long)puVar4 +
                          local_40.dynamic_dims_._M_elems[1] * uVar5;
      local_90 = piVar1 + true_idx;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[sub_l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xf6,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_e0,&local_90);
      piVar1[local_40.dynamic_dims_._M_elems[0] * (long)puVar4 +
             local_40.dynamic_dims_._M_elems[1] * uVar5] = 0x47;
      local_e0._0_4_ = 0x47;
      boost::detail::test_eq_impl<int,int>
                ("(dptr[sub_l.index(i, j)])","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xfa,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,piVar1 + local_40.dynamic_dims_._M_elems[0] * (long)puVar4 +
                           local_40.dynamic_dims_._M_elems[1] * uVar5,(int *)&local_e0);
      pvVar2 = std::vector<int,_std::allocator<int>_>::at
                         (&data,local_40.dynamic_dims_._M_elems[0] * (long)puVar4 +
                                local_40.dynamic_dims_._M_elems[1] * uVar5);
      local_e0 = (pointer)CONCAT44(local_e0._4_4_,0x47);
      boost::detail::test_eq_impl<int,int>
                ("(data.at(sub_l.index(i, j)))","71",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0xfd,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,pvVar2,(int *)&local_e0);
    }
  }
  for (uVar5 = 0; uVar5 < local_a8 + local_c8; uVar5 = uVar5 + 1) {
    for (uVar3 = 0; uVar3 < local_b0 + local_d0; uVar3 = uVar3 + 1) {
      true_idx = (local_b0 + local_d0) * uVar5 + uVar3;
      local_e0 = (pointer)(local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                          local_a0.dynamic_dims_._M_elems[1] * uVar5);
      boost::detail::test_eq_impl<unsigned_long,unsigned_long>
                ("(l.index(i, j))","true_idx",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x106,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(unsigned_long *)&local_e0,&true_idx);
      local_e0 = piVar1 + local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                          local_a0.dynamic_dims_._M_elems[1] * uVar5;
      local_90 = piVar1 + true_idx;
      boost::detail::test_eq_impl<int*,int*>
                ("&(dptr[l.index(i, j)])","&(dptr[true_idx])",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                 ,0x108,
                 "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                 ,(int **)&local_e0,&local_90);
      if ((uVar3 < local_d0) || (local_d0 + local_b0 <= uVar3)) {
        if ((uVar5 < local_c8) || (local_c8 + local_a8 <= uVar5)) {
          if ((uVar3 % local_60 == 0) && (uVar5 % local_58 == 0)) {
            local_e0._0_4_ = 0x47;
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])","71",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                       ,0x124,
                       "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,piVar1 + local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                                 local_a0.dynamic_dims_._M_elems[1] * uVar5,(int *)&local_e0);
            pvVar2 = std::vector<int,_std::allocator<int>_>::at
                               (&data,local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                                      local_a0.dynamic_dims_._M_elems[1] * uVar5);
            local_e0 = (pointer)CONCAT44(local_e0._4_4_,0x47);
            boost::detail::test_eq_impl<int,int>
                      ("(data.at(l.index(i, j)))","71",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                       ,0x127,
                       "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,pvVar2,(int *)&local_e0);
          }
          else {
            local_e0._0_4_ = 0x2a;
            boost::detail::test_eq_impl<int,int>
                      ("(dptr[l.index(i, j)])","42",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                       ,300,
                       "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,piVar1 + local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                                 local_a0.dynamic_dims_._M_elems[1] * uVar5,(int *)&local_e0);
            pvVar2 = std::vector<int,_std::allocator<int>_>::at
                               (&data,local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                                      local_a0.dynamic_dims_._M_elems[1] * uVar5);
            local_e0 = (pointer)CONCAT44(local_e0._4_4_,0x2a);
            boost::detail::test_eq_impl<int,int>
                      ("(data.at(l.index(i, j)))","42",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                       ,0x12f,
                       "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                       ,pvVar2,(int *)&local_e0);
          }
        }
        else {
          local_e0._0_4_ = 0x18;
          boost::detail::test_eq_impl<int,int>
                    ("(dptr[l.index(i, j)])","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0x116,
                     "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,piVar1 + local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                               local_a0.dynamic_dims_._M_elems[1] * uVar5,(int *)&local_e0);
          pvVar2 = std::vector<int,_std::allocator<int>_>::at
                             (&data,local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                                    local_a0.dynamic_dims_._M_elems[1] * uVar5);
          local_e0 = (pointer)CONCAT44(local_e0._4_4_,0x18);
          boost::detail::test_eq_impl<int,int>
                    ("(data.at(l.index(i, j)))","24",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                     ,0x119,
                     "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                     ,pvVar2,(int *)&local_e0);
        }
      }
      else {
        local_e0._0_4_ = 0x11;
        boost::detail::test_eq_impl<int,int>
                  ("(dptr[l.index(i, j)])","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x10d,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,piVar1 + local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                             local_a0.dynamic_dims_._M_elems[1] * uVar5,(int *)&local_e0);
        pvVar2 = std::vector<int,_std::allocator<int>_>::at
                           (&data,local_a0.dynamic_dims_._M_elems[0] * uVar3 +
                                  local_a0.dynamic_dims_._M_elems[1] * uVar5);
        local_e0 = (pointer)CONCAT44(local_e0._4_4_,0x11);
        boost::detail::test_eq_impl<int,int>
                  ("(data.at(l.index(i, j)))","17",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/brycelelbach[P]mdspan/tests/test_layout_mapping_left_stepping_padding.cpp"
                   ,0x110,
                   "void test_2d_dynamic() [StepX = 1UL, StepY = 5UL, PadX = 0UL, PadY = 1UL, X = 30UL, Y = 30UL]"
                   ,pvVar2,(int *)&local_e0);
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&data.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void test_2d_dynamic()
{ // {{{
    layout_mapping_left<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const l{{X, Y}, {1, 1}, {PadX, PadY}};

    BOOST_TEST_EQ((l.is_regular()), true);

    BOOST_TEST_EQ((l.stride(0)), 1);
    BOOST_TEST_EQ((l.stride(1)), 1);

    BOOST_TEST_EQ((l.size()), X * Y);
    BOOST_TEST_EQ((l.span()), (X + PadX) * (Y + PadY));

    layout_mapping_left<
        dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
      , dimensions<dyn, dyn>
    > const sub_l{{X / StepX, Y / StepY}, {StepX, StepY}, {PadX, PadY}};

    BOOST_TEST_EQ((sub_l.is_regular()), true);

    BOOST_TEST_EQ((sub_l.stride(0)), StepX);
    BOOST_TEST_EQ((sub_l.stride(1)), StepY);

    BOOST_TEST_EQ((sub_l.size()), (X / StepX) * (Y / StepY));
    BOOST_TEST_EQ((sub_l.span()), (X + PadX) * (Y + PadY));

    // Initialize all elements to 42.
    std::vector<int> data(
        (l[0] + l.pads()[0]) * (l[1] + l.pads()[1]), 42
    );
    int* dptr = data.data();

    // Set X pad elements to 17 and Y pad elements to 24. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            dptr[l.index(i, j)] = 17;
            
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            dptr[l.index(i, j)] = 24; 

            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }
    }

    // Set every (StepXth, StepYth) element to 71.
    for (auto j = 0; j < sub_l[1]; ++j)
    for (auto i = 0; i < sub_l[0]; ++i)
    {
        auto const p = l.pads();
        auto const s = sub_l.steps();
        auto const true_idx = (s[0] * i) + (sub_l[0] * s[0] + p[0]) * (s[1] * j);

        BOOST_TEST_EQ((sub_l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[sub_l.index(i, j)]), &(dptr[true_idx])); 

        dptr[sub_l.index(i, j)] = 71;

        BOOST_TEST_EQ((dptr[sub_l.index(i, j)]), 71);

        // Bounds-checking.
        BOOST_TEST_EQ((data.at(sub_l.index(i, j))), 71);
    }

    // Check final structure. 
    for (auto j = 0; j < l[1] + l.pads()[1]; ++j)
    for (auto i = 0; i < l[0] + l.pads()[0]; ++i)
    {
        auto const true_idx = (i) + (l[0] + l.pads()[0]) * (j);

        BOOST_TEST_EQ((l.index(i, j)), true_idx);

        BOOST_TEST_EQ(&(dptr[l.index(i, j)]), &(dptr[true_idx])); 

        // X-pad element.
        if      ((l[0] <= i) && (i < (l[0] + l.pads()[0])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 17);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 17);
        }

        // Y-pad element.
        else if ((l[1] <= j) && (j < (l[1] + l.pads()[1])))
        {
            BOOST_TEST_EQ((dptr[l.index(i, j)]), 24);

            // Bounds-checking.
            BOOST_TEST_EQ((data.at(l.index(i, j))), 24);
        }

        // Real element.
        else
        {
            // Real element in the strided sub-box.
            if (  (0 == (i % sub_l.steps()[0]))
               && (0 == (j % sub_l.steps()[1]))
               )
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 71);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 71);
            }
            // Real element not in the strided sub-box.
            else
            {
                BOOST_TEST_EQ((dptr[l.index(i, j)]), 42);

                // Bounds-checking.
                BOOST_TEST_EQ((data.at(l.index(i, j))), 42);
            }
        }
    }
}